

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O2

QRect __thiscall QRect::operator&(QRect *this,QRect *r)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  QRect QVar16;
  
  uVar14 = 0xffffffff00000000;
  uVar7 = 0xffffffff;
  bVar3 = isNull(this);
  if ((!bVar3) && (bVar3 = isNull(r), !bVar3)) {
    uVar11 = (this->x1).m_i;
    uVar10 = (this->x2).m_i;
    uVar8 = uVar11 - 1;
    uVar9 = uVar10 + 1;
    if ((int)uVar8 <= (int)uVar10) {
      uVar9 = uVar11;
    }
    if ((int)uVar8 < (int)uVar10) {
      uVar8 = uVar10;
    }
    uVar11 = (r->x1).m_i;
    uVar10 = (r->x2).m_i;
    uVar4 = uVar11 - 1;
    uVar5 = uVar10 + 1;
    if ((int)uVar4 <= (int)uVar10) {
      uVar5 = uVar11;
    }
    if ((int)uVar4 < (int)uVar10) {
      uVar4 = uVar10;
    }
    if ((int)uVar5 <= (int)uVar8 && (int)uVar9 <= (int)uVar4) {
      uVar10 = (this->y1).m_i;
      uVar1 = (this->y2).m_i;
      uVar11 = uVar10 - 1;
      uVar13 = uVar1 + 1;
      if ((int)uVar11 <= (int)uVar1) {
        uVar13 = uVar10;
      }
      if ((int)uVar11 < (int)uVar1) {
        uVar11 = uVar1;
      }
      uVar1 = (r->y1).m_i;
      uVar2 = (r->y2).m_i;
      uVar10 = uVar1 - 1;
      uVar12 = uVar2 + 1;
      if ((int)uVar10 <= (int)uVar2) {
        uVar12 = uVar1;
      }
      if ((int)uVar10 < (int)uVar2) {
        uVar10 = uVar2;
      }
      uVar6 = 0;
      if ((int)uVar13 <= (int)uVar10) {
        uVar15 = 0;
        if ((int)uVar12 <= (int)uVar11) {
          if ((int)uVar5 < (int)uVar9) {
            uVar5 = uVar9;
          }
          uVar6 = (ulong)uVar5;
          if ((int)uVar8 < (int)uVar4) {
            uVar4 = uVar8;
          }
          uVar7 = (ulong)uVar4;
          if ((int)uVar12 < (int)uVar13) {
            uVar12 = uVar13;
          }
          if ((int)uVar11 < (int)uVar10) {
            uVar10 = uVar11;
          }
          uVar15 = (ulong)uVar12 << 0x20;
          uVar14 = (ulong)uVar10 << 0x20;
        }
        goto LAB_00347f58;
      }
    }
  }
  uVar6 = 0;
  uVar15 = 0;
LAB_00347f58:
  QVar16._0_8_ = uVar6 | uVar15;
  QVar16.x2.m_i = (int)(uVar7 | uVar14);
  QVar16.y2.m_i = (int)((uVar7 | uVar14) >> 0x20);
  return QVar16;
}

Assistant:

QRect QRect::operator&(const QRect &r) const noexcept
{
    if (isNull() || r.isNull())
        return QRect();

    Representation l1 = x1;
    Representation r1 = x2;
    if (x2 < x1 - 1) {
        l1 = x2 + 1;
        r1 = x1 - 1;
    }

    Representation l2 = r.x1;
    Representation r2 = r.x2;
    if (r.x2 < r.x1 - 1) {
        l2 = r.x2 + 1;
        r2 = r.x1 - 1;
    }

    if (l1 > r2 || l2 > r1)
        return QRect();

    Representation t1 = y1;
    Representation b1 = y2;
    if (y2 < y1 - 1) {
        t1 = y2 + 1;
        b1 = y1 - 1;
    }

    Representation t2 = r.y1;
    Representation b2 = r.y2;
    if (r.y2 < r.y1 - 1) {
        t2 = r.y2 + 1;
        b2 = r.y1 - 1;
    }

    if (t1 > b2 || t2 > b1)
        return QRect();

    QRect tmp;
    tmp.x1 = qMax(l1, l2);
    tmp.x2 = qMin(r1, r2);
    tmp.y1 = qMax(t1, t2);
    tmp.y2 = qMin(b1, b2);
    return tmp;
}